

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::FBXImporter::CanRead(FBXImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  char *tokens [1];
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  BaseImporter::GetExtension(&local_70,pFile);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"fbx","");
  plVar1 = local_50;
  if (local_70._M_string_length == local_48) {
    if (local_70._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp(local_70._M_dataplus._M_p,local_50,local_70._M_string_length);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (plVar1 != local_40) {
    operator_delete(plVar1,local_40[0] + 1);
  }
  bVar2 = true;
  if (bVar4) goto LAB_005cef81;
  if (local_70._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_005cef4f;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_005cef4f:
    local_50 = (long *)0x6a6f6a;
    bVar2 = BaseImporter::SearchFileHeaderForToken
                      (pIOHandler,pFile,(char **)&local_50,1,200,false,false);
    goto LAB_005cef81;
  }
  bVar2 = false;
LAB_005cef81:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool FBXImporter::CanRead(const std::string &pFile, IOSystem *pIOHandler, bool checkSig) const {
	const std::string &extension = GetExtension(pFile);
	if (extension == std::string(desc.mFileExtensions)) {
		return true;
	}

	else if ((!extension.length() || checkSig) && pIOHandler) {
		// at least ASCII-FBX files usually have a 'FBX' somewhere in their head
		const char *tokens[] = { "fbx" };
		return SearchFileHeaderForToken(pIOHandler, pFile, tokens, 1);
	}
	return false;
}